

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjson_add.c
# Opt level: O0

void cjson_add_bool_should_fail_on_allocation_failure(void)

{
  cJSON *object;
  cJSON *pcVar1;
  cJSON *root;
  
  object = cJSON_CreateObject();
  cJSON_InitHooks(&failing_hooks);
  pcVar1 = cJSON_AddBoolToObject(object,"false",0);
  if (pcVar1 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0xeb);
  }
  cJSON_InitHooks((cJSON_Hooks *)0x0);
  cJSON_Delete(object);
  return;
}

Assistant:

static void cjson_add_bool_should_fail_on_allocation_failure(void)
{
    cJSON *root = cJSON_CreateObject();

    cJSON_InitHooks(&failing_hooks);

    TEST_ASSERT_NULL(cJSON_AddBoolToObject(root, "false", false));

    cJSON_InitHooks(NULL);

    cJSON_Delete(root);
}